

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

url_mapper * __thiscall
cppcms::url_mapper::get_mapper_for_key
          (url_mapper *this,string_key *key,string_key *real_key,
          vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *keywords)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t pos;
  url_mapper *local_80;
  url_mapper *local_78;
  string_key subapp;
  
  bVar2 = string_key::empty(key);
  if (bVar2) {
    (real_key->key_)._M_string_length = 0;
    real_key->begin_ = (char *)0x0;
    real_key->end_ = (char *)0x0;
    *(real_key->key_)._M_dataplus._M_p = '\0';
    local_78 = this;
  }
  else {
    pcVar3 = key->begin_;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (key->key_)._M_dataplus._M_p;
    }
    cVar1 = *pcVar3;
    if (cVar1 == '/') {
      this = topmost(this);
    }
    pos = (size_t)(cVar1 == '/');
    local_80 = this;
    do {
      sVar4 = string_key::find(key,'/',pos);
      if (sVar4 == 0xffffffffffffffff) {
        sVar5 = string_key::find(key,';',pos);
        if (sVar5 == 0xffffffffffffffff) {
          string_key::unowned_substr(&subapp,key,pos,0xffffffffffffffff);
          string_key::operator=(real_key,&subapp);
          std::__cxx11::string::~string((string *)&subapp.key_);
        }
        else {
          std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::reserve(keywords,6);
          string_key::unowned_substr(&subapp,key,pos,sVar5 - pos);
          string_key::operator=(real_key,&subapp);
          std::__cxx11::string::~string((string *)&subapp.key_);
          do {
            pos = sVar5 + 1;
            sVar5 = string_key::find(key,',',pos);
            string_key::unowned_substr(&subapp,key,pos,sVar5 - pos);
            std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::
            emplace_back<cppcms::string_key>(keywords,&subapp);
            std::__cxx11::string::~string((string *)&subapp.key_);
          } while (sVar5 != 0xffffffffffffffff);
        }
        bVar2 = operator==(real_key,".");
        if (bVar2) {
LAB_0020fa5e:
          (real_key->key_)._M_string_length = 0;
          real_key->begin_ = (char *)0x0;
          real_key->end_ = (char *)0x0;
          *(real_key->key_)._M_dataplus._M_p = '\0';
        }
        else {
          bVar2 = operator==(real_key,"..");
          if (bVar2) {
            local_80 = parent(local_80);
            goto LAB_0020fa5e;
          }
        }
        local_78 = data::is_app((local_80->d).ptr_,real_key);
        if (local_78 == (url_mapper *)0x0) {
          local_78 = local_80;
        }
        else {
          (real_key->key_)._M_string_length = 0;
          real_key->begin_ = (char *)0x0;
          real_key->end_ = (char *)0x0;
          *(real_key->key_)._M_dataplus._M_p = '\0';
        }
      }
      else {
        string_key::unowned_substr(&subapp,key,pos,sVar4 - pos);
        bVar2 = operator==(&subapp,".");
        if (!bVar2) {
          bVar2 = operator==(&subapp,"..");
          if (bVar2) {
            local_80 = parent(local_80);
          }
          else {
            local_80 = data::child((local_80->d).ptr_,&subapp,key);
          }
        }
        pos = sVar4 + 1;
        std::__cxx11::string::~string((string *)&subapp.key_);
      }
    } while (sVar4 != 0xffffffffffffffff);
  }
  return local_78;
}

Assistant:

url_mapper &url_mapper::get_mapper_for_key(string_key const &key,string_key &real_key,std::vector<string_key> &keywords)
	{
		url_mapper *mapper = this;
		size_t pos = 0;
		if(key.empty()) {
			real_key.clear();
			return *mapper;
		}
		if(key[0]=='/') {
			mapper = &mapper->topmost();
			pos = 1;
		}
		for(;;) {
			size_t end = key.find('/',pos);
			if(end == std::string::npos) {
				size_t separator = key.find(';',pos);
				if(separator == std::string::npos) {
					real_key = key.unowned_substr(pos);
				}
				else {
					keywords.reserve(6);
					real_key = key.unowned_substr(pos,separator - pos);
					pos = separator + 1;
					for(;;){
						end = key.find(',',pos);
						size_t size = end - pos;
						keywords.push_back(key.unowned_substr(pos,size));
						if(end == std::string::npos)
							break;
						pos = end + 1;
					}
					
				}
				if(real_key == ".")
					real_key.clear();
				else if(real_key == "..") {
					mapper = &mapper->parent();
					real_key.clear();
				}
					
				url_mapper *tmp = mapper->d->is_app(real_key);
				if(tmp) { 
					// empty special key
					real_key.clear();
					return *tmp;
				}
				return *mapper;
			}
			size_t chunk_size = end - pos;
			string_key subapp = key.unowned_substr(pos,chunk_size);
			if(subapp == ".")
				; // Just continue where we are
			else if(subapp == "..") {
				mapper = &mapper->parent();
			}
			else {
				mapper = &mapper->d->child(subapp,key);
			}
			pos = end + 1;
		}
	}